

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O1

FString __thiscall GMESong::GetStats(GMESong *this)

{
  int iVar1;
  long in_RSI;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)0x727dbc;
  if (*(long *)(in_RSI + 0x28) != 0) {
    iVar1 = gme_tell(*(Music_Emu **)(in_RSI + 0x20));
    FString::Format((FString *)this,
                    "Track: \x1cK%d\x1c-  Time:\x1cK%3d:%02d:%03d\x1c-  System: \x1cK%s\x1c-",
                    (ulong)*(uint *)(in_RSI + 0x34),(ulong)(uint)(iVar1 / 60000),
                    (ulong)(uint)((iVar1 / 1000) % 0x3c),(ulong)(uint)(iVar1 % 1000),
                    *(undefined8 *)(*(long *)(in_RSI + 0x28) + 0x40));
  }
  return (FString)(char *)this;
}

Assistant:

FString GMESong::GetStats()
{
	FString out;

	if (TrackInfo != NULL)
	{
		int time = gme_tell(Emu);
		out.Format(
			"Track: " TEXTCOLOR_YELLOW "%d" TEXTCOLOR_NORMAL
			"  Time:" TEXTCOLOR_YELLOW "%3d:%02d:%03d" TEXTCOLOR_NORMAL
			"  System: " TEXTCOLOR_YELLOW "%s" TEXTCOLOR_NORMAL,
			CurrTrack,
			time/60000,
			(time/1000) % 60,
			time % 1000,
			TrackInfo->system);
	}
	return out;
}